

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenVectorForceAlign
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,string *field_size)

{
  BaseType BVar1;
  StructDef *def;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  const_iterator cVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  size_type *psVar11;
  long lVar12;
  uint __len;
  Type vtype;
  string __str;
  string local_190;
  _Alloc_hider local_170;
  StructDef *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 != BASE_TYPE_VECTOR) && (BVar1 != BASE_TYPE_VECTOR64)) {
    __assert_fail("IsVector(field.value.type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0xb8b,
                  "std::string flatbuffers::cpp::CppGenerator::GenVectorForceAlign(const FieldDef &, const std::string &)"
                 );
  }
  local_170._M_p = (pointer)&local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"force_align","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(field->super_Definition).attributes,(key_type *)&local_170);
  if ((_Rb_tree_header *)cVar5._M_node ==
      &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    lVar12 = 0;
  }
  else {
    lVar12 = *(long *)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  if ((lVar12 == 0) || (uVar4 = atoi(*(char **)(lVar12 + 0x20)), (int)uVar4 < 2)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_170._M_p._0_4_ = (field->value).type.element;
  def = (field->value).type.struct_def;
  local_160._M_allocated_capacity = (size_type)(field->value).type.enum_def;
  local_160._8_2_ = (field->value).type.fixed_length;
  local_170._M_p._4_4_ = 0;
  local_168 = def;
  if (((BaseType)local_170._M_p == BASE_TYPE_STRUCT) && (def->fixed == true)) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
    BaseGenerator::WrapInNameSpace
              (&local_50,&this->super_BaseGenerator,&def->super_Definition,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    GenTypeWire_abi_cxx11_(&local_50,this,(Type *)&local_170,"",false,field->offset64);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"_fbb.ForceVectorAlignment","")
  ;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_110 = &local_100;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_100 = *plVar8;
    lStack_f8 = plVar6[3];
  }
  else {
    local_100 = *plVar8;
    local_110 = (long *)*plVar6;
  }
  local_108 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)(field_size->_M_dataplus)._M_p);
  local_f0 = &local_e0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_e0 = *plVar8;
    lStack_d8 = plVar6[3];
  }
  else {
    local_e0 = *plVar8;
    local_f0 = (long *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_d0 = &local_c0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_c0 = *plVar8;
    lStack_b8 = plVar6[3];
  }
  else {
    local_c0 = *plVar8;
    local_d0 = (long *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)local_50._M_dataplus._M_p);
  local_b0 = &local_a0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_140 = *puVar9;
    lStack_138 = plVar6[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar9;
    local_150 = (ulong *)*plVar6;
  }
  local_148 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __len = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_00195732;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_00195732;
      }
      if (uVar10 < 10000) goto LAB_00195732;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00195732:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_130,__len,(ulong)uVar4);
  uVar10 = 0xf;
  if (local_150 != &local_140) {
    uVar10 = local_140;
  }
  if (uVar10 < (ulong)(local_128 + local_148)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if ((ulong)(local_128 + local_148) <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
      goto LAB_001957b7;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
LAB_001957b7:
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190.field_2._8_8_ = puVar7[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar11;
    local_190._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_190._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_190);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar12 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar12;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenVectorForceAlign(const FieldDef &field,
                                  const std::string &field_size) {
    FLATBUFFERS_ASSERT(IsVector(field.value.type));
    // Get the value of the force_align attribute.
    const auto *force_align = field.attributes.Lookup("force_align");
    const int align = force_align ? atoi(force_align->constant.c_str()) : 1;
    // Generate code to do force_align for the vector.
    if (align > 1) {
      const auto vtype = field.value.type.VectorType();
      const std::string &type =
          IsStruct(vtype) ? WrapInNameSpace(*vtype.struct_def)
                          : GenTypeWire(vtype, "", false, field.offset64);
      return std::string("_fbb.ForceVectorAlignment") +
             (field.offset64 ? "64" : "") + "(" + field_size + ", sizeof(" +
             type + "), " + std::to_string(static_cast<long long>(align)) +
             ");";
    }
    return "";
  }